

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Expression * __thiscall
wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
findBreakTarget(ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                *this,Name name)

{
  pointer ppEVar1;
  bool bVar2;
  bool bVar3;
  Expression *pEVar4;
  Expression *pEVar5;
  uint uVar6;
  long lVar7;
  array<wasm::Expression_*,_10UL> *paVar8;
  
  pEVar5 = (Expression *)(this->expressionStack).usedFixed;
  ppEVar1 = (this->expressionStack).flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar7 = (long)(this->expressionStack).flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3;
  if (&pEVar5->_id + lVar7 == (Id *)0x0) {
    __assert_fail("!expressionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x1cd,
                  "Expression *wasm::ExpressionStackWalker<wasm::Flatten, wasm::UnifiedExpressionVisitor<wasm::Flatten>>::findBreakTarget(Name) [SubType = wasm::Flatten, VisitorType = wasm::UnifiedExpressionVisitor<wasm::Flatten>]"
                 );
  }
  uVar6 = ((int)lVar7 + (int)pEVar5) - 1;
  do {
    paVar8 = (array<wasm::Expression_*,_10UL> *)(ppEVar1 + -10);
    if (uVar6 < 10) {
      paVar8 = &(this->expressionStack).fixed;
    }
    pEVar4 = paVar8->_M_elems[uVar6];
    if (pEVar4->_id == LoopId) {
      if ((char *)pEVar4[1].type.id != name.super_IString.str._M_str) goto LAB_0086e041;
      bVar2 = false;
LAB_0086e044:
      pEVar5 = pEVar4;
      if (bVar2) {
LAB_0086e049:
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    else {
      if (pEVar4->_id != BlockId) {
LAB_0086e041:
        bVar2 = true;
        pEVar4 = pEVar5;
        goto LAB_0086e044;
      }
      if ((char *)pEVar4[1].type.id != name.super_IString.str._M_str) goto LAB_0086e049;
      bVar2 = false;
      pEVar5 = pEVar4;
    }
    bVar3 = false;
    if (bVar2) {
      if (uVar6 == 0) {
        uVar6 = 0;
        pEVar5 = (Expression *)0x0;
      }
      else {
        uVar6 = uVar6 - 1;
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
    if (!bVar3) {
      return pEVar5;
    }
  } while( true );
}

Assistant:

Expression* findBreakTarget(Name name) {
    assert(!expressionStack.empty());
    Index i = expressionStack.size() - 1;
    while (true) {
      auto* curr = expressionStack[i];
      if (Block* block = curr->template dynCast<Block>()) {
        if (name == block->name) {
          return curr;
        }
      } else if (Loop* loop = curr->template dynCast<Loop>()) {
        if (name == loop->name) {
          return curr;
        }
      }
      if (i == 0) {
        return nullptr;
      }
      i--;
    }
  }